

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86_avx.cpp
# Opt level: O0

void __thiscall ncnn::Clip_x86_avx::forward_inplace(Clip_x86_avx *this)

{
  Option *in_stack_00000250;
  Mat *in_stack_00000258;
  Clip_x86_avx *in_stack_00000260;
  
  forward_inplace(in_stack_00000260,in_stack_00000258,in_stack_00000250);
  return;
}

Assistant:

int Clip_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _max = _mm256_set1_ps(max);
            __m256 _min = _mm256_set1_ps(min);

            for (int i = 0; i < size; i++)
            {
                __m256 _ptr = _mm256_loadu_ps(ptr);
                _ptr = _mm256_max_ps(_ptr, _min);
                _ptr = _mm256_min_ps(_ptr, _max);
                _mm256_storeu_ps(ptr, _ptr);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _max = _mm_set1_ps(max);
            __m128 _min = _mm_set1_ps(min);

            for (int i = 0; i < size; i++)
            {
                __m128 _ptr = _mm_loadu_ps(ptr);
                _ptr = _mm_max_ps(_ptr, _min);
                _ptr = _mm_min_ps(_ptr, _max);
                _mm_storeu_ps(ptr, _ptr);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int remain = size;
        for (; remain > 0; remain--)
        {
            if (*ptr < min)
                *ptr = min;

            if (*ptr > max)
                *ptr = max;

            ptr++;
        }
    }

    return 0;
}